

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::GetSubstitutionRange(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  FormatSpec<std::basic_string_view<char>,_unsigned_long,_unsigned_long> local_18;
  
  local_18.super_type.spec_.data_ = "variable used for annotation used multiple times: %s (%d..%d)";
  local_18.super_type.spec_.size_ = 0x3d;
  StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_unsigned_long>
            (__return_storage_ptr__,&local_18,
             (basic_string_view<char,_std::char_traits<char>_> *)(this + 0x10),(unsigned_long *)this
             ,(unsigned_long *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}